

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

xmlChar * htmlParsePubidLiteral(htmlParserCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  byte bVar2;
  xmlChar *pxVar3;
  bool bVar4;
  byte bVar5;
  xmlChar *pxVar6;
  undefined8 in_RCX;
  char *msg;
  int len;
  xmlParserErrors error;
  
  bVar2 = *ctxt->input->cur;
  if ((bVar2 == 0x22) || (bVar2 == 0x27)) {
    xmlNextChar(ctxt);
    pxVar6 = ctxt->input->cur;
    ppxVar1 = &ctxt->input->base;
    pxVar3 = *ppxVar1;
    if (pxVar6 < *ppxVar1) {
      return (xmlChar *)0x0;
    }
    bVar5 = *ctxt->input->cur;
    bVar4 = true;
    len = 0;
    if ((bVar5 != 0) && (len = 0, bVar5 != bVar2)) {
      len = 0;
      bVar4 = false;
      do {
        if (""[(long)(ulong)bVar5] == '\0') {
          htmlParseErrInt(ctxt,0x1f9a65,(char *)(ulong)bVar5,(int)in_RCX);
          bVar4 = true;
        }
        xmlNextChar(ctxt);
        bVar5 = *ctxt->input->cur;
        len = len + 1;
      } while ((bVar5 != 0) && (bVar5 != bVar2));
      bVar4 = !bVar4;
    }
    if (bVar5 == 0x22) {
      xmlNextChar(ctxt);
      if (!bVar4) {
        return (xmlChar *)0x0;
      }
      pxVar6 = xmlStrndup(ctxt->input->base + ((long)pxVar6 - (long)pxVar3),len);
      return pxVar6;
    }
    msg = "Unfinished PubidLiteral\n";
    error = XML_ERR_LITERAL_NOT_FINISHED;
  }
  else {
    msg = "PubidLiteral \" or \' expected\n";
    error = XML_ERR_LITERAL_NOT_STARTED;
  }
  htmlParseErr(ctxt,error,msg,(xmlChar *)0x0,(xmlChar *)0x0);
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
htmlParsePubidLiteral(htmlParserCtxtPtr ctxt) {
    size_t len = 0, startPosition = 0;
    int err = 0;
    int quote;
    xmlChar *ret = NULL;

    if ((CUR != '"') && (CUR != '\'')) {
	htmlParseErr(ctxt, XML_ERR_LITERAL_NOT_STARTED,
	             "PubidLiteral \" or ' expected\n", NULL, NULL);
        return(NULL);
    }
    quote = CUR;
    NEXT;

    /*
     * Name ::= (Letter | '_') (NameChar)*
     */
    if (CUR_PTR < BASE_PTR)
        return(ret);
    startPosition = CUR_PTR - BASE_PTR;

    while ((CUR != 0) && (CUR != quote)) {
        if (!IS_PUBIDCHAR_CH(CUR)) {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Invalid char in PubidLiteral 0x%X\n", CUR);
            err = 1;
        }
        len++;
        NEXT;
    }

    if (CUR != '"') {
        htmlParseErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED,
                     "Unfinished PubidLiteral\n", NULL, NULL);
    } else {
        NEXT;
        if (err == 0)
            ret = xmlStrndup((BASE_PTR + startPosition), len);
    }

    return(ret);
}